

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.cpp
# Opt level: O0

void pbrt::ComputeBeamDiffusionBSSRDF(Float g,Float eta,BSSRDFTable *t)

{
  float fVar1;
  reference pvVar2;
  ulong uVar3;
  size_t sVar4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  double dVar5;
  __type_conflict1 _Var6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  function<void_(long)> *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> **start;
  anon_class_24_3_b5c30896 local_38;
  int local_18;
  int local_14;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_10;
  undefined4 local_8;
  
  local_8 = in_ZMM1._0_4_;
  local_10 = in_RDI;
  pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](in_RDI + 1,0);
  *pvVar2 = 0.0;
  pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](local_10 + 1,1)
  ;
  *pvVar2 = 0.0025;
  local_14 = 2;
  while( true ) {
    uVar3 = (ulong)local_14;
    sVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10 + 1);
    if (sVar4 <= uVar3) break;
    pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (local_10 + 1,(long)(local_14 + -1));
    fVar1 = *pvVar2;
    pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (local_10 + 1,(long)local_14);
    *pvVar2 = fVar1 * 1.2;
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    auVar7 = in_ZMM1._0_16_;
    uVar3 = (ulong)local_18;
    sVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10);
    if (sVar4 <= uVar3) break;
    in_stack_ffffffffffffff74 = (float)(local_18 * -8);
    sVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10);
    auVar7 = vcvtusi2ss_avx512f(auVar7,sVar4 - 1);
    auVar7._0_4_ = in_stack_ffffffffffffff74 / auVar7._0_4_;
    auVar7._4_12_ = SUB6012((undefined1  [60])0x0,0);
    dVar5 = std::exp(auVar7._0_8_);
    _Var6 = std::exp<int>(0);
    dVar5 = (double)(1.0 - SUB84(dVar5,0)) / (1.0 - _Var6);
    in_ZMM1 = ZEXT864((ulong)dVar5);
    pvVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (local_10,(long)local_18);
    *pvVar2 = (float)dVar5;
    local_18 = local_18 + 1;
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(local_10);
  start = &local_10;
  std::function<void(long)>::
  function<pbrt::ComputeBeamDiffusionBSSRDF(float,float,pbrt::BSSRDFTable*)::__0,void>
            ((function<void_(long)> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             &local_38);
  ParallelFor((int64_t)start,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::function<void_(long)>::~function((function<void_(long)> *)0x826999);
  return;
}

Assistant:

void ComputeBeamDiffusionBSSRDF(Float g, Float eta, BSSRDFTable *t) {
    // Choose radius values of the diffusion profile discretization
    t->radiusSamples[0] = 0;
    t->radiusSamples[1] = 2.5e-3f;
    for (int i = 2; i < t->radiusSamples.size(); ++i)
        t->radiusSamples[i] = t->radiusSamples[i - 1] * 1.2f;

    // Choose albedo values of the diffusion profile discretization
    for (int i = 0; i < t->rhoSamples.size(); ++i)
        t->rhoSamples[i] = (1 - std::exp(-8 * i / (Float)(t->rhoSamples.size() - 1))) /
                           (1 - std::exp(-8));

    ParallelFor(0, t->rhoSamples.size(), [&](int i) {
        // Compute the diffusion profile for the _i_th albedo sample
        // Compute scattering profile for chosen albedo $\rho$
        size_t nSamples = t->radiusSamples.size();
        for (int j = 0; j < nSamples; ++j) {
            Float rho = t->rhoSamples[i], r = t->radiusSamples[j];
            t->profile[i * nSamples + j] = 2 * Pi * r *
                                           (BeamDiffusionSS(rho, 1 - rho, g, eta, r) +
                                            BeamDiffusionMS(rho, 1 - rho, g, eta, r));
        }

        // Compute effective albedo $\rho_{\roman{eff}}$ and CDF for importance sampling
        t->rhoEff[i] =
            IntegrateCatmullRom(t->radiusSamples, {&t->profile[i * nSamples], nSamples},
                                {&t->profileCDF[i * nSamples], nSamples});
    });
}